

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::permute_axes(CImg<unsigned_char> *this,char *axes_order)

{
  CImg<unsigned_char> *pCVar1;
  uchar foo;
  uchar local_31;
  CImg<unsigned_char> local_30;
  
  local_31 = '\0';
  _permute_axes<unsigned_char>(&local_30,this,axes_order,&local_31);
  pCVar1 = move_to(&local_30,this);
  if ((local_30._is_shared == false) && (local_30._data != (uchar *)0x0)) {
    operator_delete__(local_30._data);
  }
  return pCVar1;
}

Assistant:

CImg<T>& permute_axes(const char *const axes_order) {
      return get_permute_axes(axes_order).move_to(*this);
    }